

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainstate.cpp
# Opt level: O3

ChainstateLoadResult *
node::LoadChainstate
          (ChainstateLoadResult *__return_storage_ptr__,ChainstateManager *chainman,
          CacheSizes *cache_sizes,ChainstateLoadOptions *options)

{
  bool *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  _Head_base<0UL,_Chainstate_*,_false> _Var7;
  string_view source_file;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  bool bVar10;
  int iVar11;
  SnapshotCompletionResult SVar12;
  optional<uint256> *poVar13;
  uchar *puVar14;
  optional<uint256> *poVar15;
  optional<arith_uint256> *this;
  optional<arith_uint256> *poVar16;
  Logger *pLVar17;
  Chainstate *this_00;
  long *plVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  long in_FS_OFFSET;
  undefined1 auVar20 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view str;
  string_view logging_function_06;
  string log_msg;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  Level in_stack_fffffffffffffe58;
  uint uVar21;
  string *__return_storage_ptr___00;
  char *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  ulong local_178 [2];
  undefined1 local_168 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  _Head_base<0UL,_node::ChainstateLoadStatus,_false> local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  long local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  undefined1 local_100 [32];
  _Alloc_hider local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Head_base<0UL,_node::ChainstateLoadStatus,_false> local_c0;
  long *local_b8;
  long local_b0;
  long local_a8 [6];
  char *local_78 [4];
  unique_lock<std::recursive_mutex> local_58 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  poVar15 = &(chainman->m_options).assumed_valid_block;
  poVar13 = inline_assertion_check<true,std::optional<uint256>const&>
                      (poVar15,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.h"
                       ,0x3da,"AssumedValidBlock","m_options.assumed_valid_block");
  pbVar1 = &(poVar13->super__Optional_base<uint256,_true,_true>)._M_payload.
            super__Optional_payload_base<uint256>._M_engaged;
  puVar14 = std::
            __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                      (poVar13,pbVar1);
  if ((bool *)puVar14 == pbVar1) {
    logging_function_00._M_str = "LoadChainstate";
    logging_function_00._M_len = 0xe;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
    ;
    source_file_01._M_len = 0x5c;
    ::LogPrintf_<>(logging_function_00,source_file_01,0xa8,
                   IPC|RAND|REINDEX|SELECTCOINS|ADDRMAN|ESTIMATEFEE|TOR|NET,
                   in_stack_fffffffffffffe58,in_stack_fffffffffffffe60);
  }
  else {
    poVar15 = inline_assertion_check<true,std::optional<uint256>const&>
                        (poVar15,
                         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.h"
                         ,0x3da,"AssumedValidBlock","m_options.assumed_valid_block");
    base_blob<256u>::GetHex_abi_cxx11_((string *)local_100,poVar15);
    logging_function._M_str = "LoadChainstate";
    logging_function._M_len = 0xe;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
    ;
    source_file_00._M_len = 0x5c;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function,source_file_00,0xa6,
               IPC|RAND|REINDEX|SELECTCOINS|ADDRMAN|RPC|WALLETDB|HTTP|MEMPOOL,
               (Level)(string *)local_100,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
    }
  }
  poVar16 = &(chainman->m_options).minimum_chain_work;
  this = inline_assertion_check<true,std::optional<arith_uint256>const&>
                   (poVar16,
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.h"
                    ,0x3d9,"MinimumChainWork","m_options.minimum_chain_work");
  __return_storage_ptr___00 = (string *)local_100;
  base_uint<256u>::GetHex_abi_cxx11_(__return_storage_ptr___00,this);
  logging_function_01._M_str = "LoadChainstate";
  logging_function_01._M_len = 0xe;
  source_file_02._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
  ;
  source_file_02._M_len = 0x5c;
  ::LogPrintf_<std::__cxx11::string>
            (logging_function_01,source_file_02,0xaa,
             IPC|RAND|REINDEX|SELECTCOINS|ADDRMAN|ESTIMATEFEE|ZMQ|HTTP|TOR,
             (Level)__return_storage_ptr___00,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
  }
  poVar16 = inline_assertion_check<true,std::optional<arith_uint256>const&>
                      (poVar16,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.h"
                       ,0x3d9,"MinimumChainWork","m_options.minimum_chain_work");
  UintToArith256((arith_uint256 *)local_100,
                 &(((chainman->m_options).chainparams)->consensus).nMinimumChainWork);
  iVar11 = base_uint<256U>::CompareTo((base_uint<256U> *)poVar16,(base_uint<256U> *)local_100);
  if (iVar11 < 0) {
    base_blob<256u>::GetHex_abi_cxx11_
              ((string *)local_100,
               &(((chainman->m_options).chainparams)->consensus).nMinimumChainWork);
    logging_function_02._M_str = "LoadChainstate";
    logging_function_02._M_len = 0xe;
    source_file_03._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
    ;
    source_file_03._M_len = 0x5c;
    __return_storage_ptr___00 = (string *)local_100;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function_02,source_file_03,0xac,
               IPC|RAND|REINDEX|SELECTCOINS|ADDRMAN|ESTIMATEFEE|WALLETDB|HTTP,
               (Level)(string *)local_100,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
    }
  }
  uVar6 = (chainman->m_blockman).m_opts.prune_target;
  plVar3 = (long *)(local_100 + 0x10);
  if (uVar6 != 0) {
    if (uVar6 == 0xffffffffffffffff) {
      logging_function_03._M_str = "LoadChainstate";
      logging_function_03._M_len = 0xe;
      source_file_04._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
      ;
      source_file_04._M_len = 0x5c;
      ::LogPrintf_<>(logging_function_03,source_file_04,0xaf,
                     IPC|RAND|REINDEX|SELECTCOINS|ADDRMAN|ESTIMATEFEE|RPC|TOR,
                     (Level)__return_storage_ptr___00,in_stack_fffffffffffffe60);
    }
    else {
      local_178[0] = uVar6 >> 0x14;
      pLVar17 = LogInstance();
      bVar10 = BCLog::Logger::Enabled(pLVar17);
      if (bVar10) {
        local_100._8_8_ = 0;
        local_100[0x10] = '\0';
        local_100._0_8_ = plVar3;
        tinyformat::format<unsigned_long>
                  ((string *)local_168,
                   "Prune configured to target %u MiB on disk for block and undo files.\n",local_178
                  );
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._0_8_ !=
            &(((ChainstateLoadResult *)local_168)->
             super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
             super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
             _M_head_impl.original.field_2) {
          operator_delete((void *)local_168._0_8_,CONCAT71(local_168._17_7_,local_168[0x10]) + 1);
        }
        pLVar17 = LogInstance();
        local_168._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x5c;
        local_168._8_8_ =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
        ;
        uVar21 = 0x5c;
        in_stack_fffffffffffffe60 =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
        ;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
        ;
        source_file._M_len = 0x5c;
        str._M_str = (char *)local_100._0_8_;
        str._M_len = local_100._8_8_;
        logging_function_06._M_str = "LoadChainstate";
        logging_function_06._M_len = 0xe;
        BCLog::Logger::LogPrintStr(pLVar17,str,logging_function_06,source_file,0xb1,ALL,Info);
        __return_storage_ptr___00 = (string *)(ulong)uVar21;
        if ((long *)local_100._0_8_ != plVar3) {
          operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
          __return_storage_ptr___00 = (string *)(ulong)uVar21;
        }
      }
    }
  }
  local_58[0]._M_device = &cs_main.super_recursive_mutex;
  local_58[0]._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(local_58);
  uVar4 = cache_sizes->coins_db;
  uVar5 = cache_sizes->coins;
  auVar20._8_4_ = (int)uVar4;
  auVar20._0_8_ = uVar5;
  auVar20._12_4_ = (int)((ulong)uVar4 >> 0x20);
  chainman->m_total_coinstip_cache = uVar5;
  chainman->m_total_coinsdb_cache = auVar20._8_8_;
  ChainstateManager::InitializeChainstate(chainman,options->mempool);
  bVar10 = ChainstateManager::DetectSnapshotChainstate(chainman);
  if ((bVar10) && (options->wipe_chainstate_db == true)) {
    logging_function_04._M_str = "LoadChainstate";
    logging_function_04._M_len = 0xe;
    source_file_05._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
    ;
    source_file_05._M_len = 0x5c;
    ::LogPrintf_<>(logging_function_04,source_file_05,0xc0,IPC|RAND|CMPCTBLOCK|ZMQ|HTTP|MEMPOOL|NET,
                   (Level)__return_storage_ptr___00,in_stack_fffffffffffffe60);
    bVar10 = ChainstateManager::DeleteSnapshotChainstate(chainman);
    if (bVar10) goto LAB_00221e06;
    local_b8 = local_a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Couldn\'t remove snapshot chainstate.","");
    local_100._0_8_ = plVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_100,local_b8,(long)local_b8 + local_b0);
    local_e0._M_p = (pointer)&local_d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,local_b8,(long)local_b8 + local_b0);
    paVar19 = &(__return_storage_ptr__->
               super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
               super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
               _M_head_impl.original.field_2;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
    super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.
    original._M_dataplus._M_p = (pointer)paVar19;
    if ((long *)local_100._0_8_ == plVar3) {
      paVar19->_M_allocated_capacity = CONCAT71(local_100._17_7_,local_100[0x10]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
               super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
               _M_head_impl.original.field_2 + 8) = local_100._24_8_;
    }
    else {
      (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .original._M_dataplus._M_p = (pointer)local_100._0_8_;
      (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .original.field_2._M_allocated_capacity = CONCAT71(local_100._17_7_,local_100[0x10]);
    }
    (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
    super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.
    original._M_string_length = local_100._8_8_;
    local_100._8_8_ = 0;
    local_100[0x10] = '\0';
    paVar19 = &(__return_storage_ptr__->
               super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
               super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
               _M_head_impl.translated.field_2;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
    super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.
    translated._M_dataplus._M_p = (pointer)paVar19;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_p == &local_d0) {
      paVar19->_M_allocated_capacity =
           CONCAT71(local_d0._M_allocated_capacity._1_7_,local_d0._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
               super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
               _M_head_impl.translated.field_2 + 8) = local_d0._8_8_;
    }
    else {
      (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .translated._M_dataplus._M_p = local_e0._M_p;
      (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .translated.field_2._M_allocated_capacity =
           CONCAT71(local_d0._M_allocated_capacity._1_7_,local_d0._M_local_buf[0]);
    }
    (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
    super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.
    translated._M_string_length = local_d8;
    local_d8 = 0;
    local_d0._M_local_buf[0] = '\0';
    (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
    super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl = FAILURE_FATAL;
    plVar18 = local_b8;
    local_100._0_8_ = plVar3;
    local_e0._M_p = (pointer)&local_d0;
    if (local_b8 == local_a8) goto LAB_00221e82;
  }
  else {
LAB_00221e06:
    CompleteChainstateInitialization((ChainstateLoadResult *)local_100,chainman,cache_sizes,options)
    ;
    if (local_c0._M_head_impl == SUCCESS) {
      SVar12 = ChainstateManager::MaybeCompleteSnapshotValidation(chainman);
      if (SVar12 == SUCCESS) {
        logging_function_05._M_str = "LoadChainstate";
        logging_function_05._M_len = 0xe;
        source_file_06._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
        ;
        source_file_06._M_len = 0x5c;
        ::LogPrintf_<>(logging_function_05,source_file_06,0xd8,
                       IPC|RAND|CMPCTBLOCK|RPC|HTTP|MEMPOOL|NET,(Level)__return_storage_ptr___00,
                       in_stack_fffffffffffffe60);
        bVar10 = ChainstateManager::ValidatedSnapshotCleanup(chainman);
        if (bVar10) {
          ChainstateManager::GetAll
                    ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)local_168,chainman);
          if (local_168._0_8_ != local_168._8_8_) {
            __assert_fail("chainman.GetAll().empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
                          ,0xe0,
                          "ChainstateLoadResult node::LoadChainstate(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                         );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete((void *)local_168._0_8_,
                            CONCAT71(local_168._17_7_,local_168[0x10]) - local_168._0_8_);
          }
          bVar10 = ChainstateManager::IsSnapshotActive(chainman);
          if (bVar10) {
            __assert_fail("!chainman.IsSnapshotActive()",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
                          ,0xe1,
                          "ChainstateLoadResult node::LoadChainstate(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                         );
          }
          if ((((chainman->m_snapshot_chainstate)._M_t.
                super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0) &&
              (_Var7._M_head_impl =
                    (chainman->m_ibd_chainstate)._M_t.
                    super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                    super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                    super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,
              _Var7._M_head_impl != (Chainstate *)0x0)) &&
             ((_Var7._M_head_impl)->m_disabled == true)) {
            __assert_fail("!chainman.IsSnapshotValidated()",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
                          ,0xe2,
                          "ChainstateLoadResult node::LoadChainstate(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                         );
          }
          ChainstateManager::InitializeChainstate(chainman,options->mempool);
          this_00 = ChainstateManager::ActiveChainstate(chainman);
          Chainstate::ClearBlockIndexCandidates(this_00);
          CompleteChainstateInitialization
                    ((ChainstateLoadResult *)local_168,chainman,cache_sizes,options);
          if (local_128._M_head_impl == SUCCESS) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p !=
                &(((ChainstateLoadResult *)local_168)->
                 super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                 super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                 _M_head_impl.translated.field_2) {
              operator_delete(local_148._M_dataplus._M_p,
                              CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                       local_148.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._0_8_ !=
                &(((ChainstateLoadResult *)local_168)->
                 super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                 super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                 _M_head_impl.original.field_2) {
              operator_delete((void *)local_168._0_8_,CONCAT71(local_168._17_7_,local_168[0x10]) + 1
                             );
            }
            goto LAB_00221ed4;
          }
          std::_Head_base<1ul,bilingual_str,false>::_Head_base<bilingual_str&>
                    ((_Head_base<1ul,bilingual_str,false> *)__return_storage_ptr__,
                     (bilingual_str *)local_168);
          (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>
          ).super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl =
               local_128._M_head_impl;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p !=
              &(((ChainstateLoadResult *)local_168)->
               super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
               super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
               _M_head_impl.translated.field_2) {
            operator_delete(local_148._M_dataplus._M_p,
                            CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                     local_148.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._0_8_ ==
              &(((ChainstateLoadResult *)local_168)->
               super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
               super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
               _M_head_impl.original.field_2) goto LAB_00221e44;
LAB_002220e6:
          local_110._M_allocated_capacity = CONCAT71(local_168._17_7_,local_168[0x10]);
          paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168._0_8_;
        }
        else {
          local_120 = &local_110;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_120,"Background chainstate cleanup failed unexpectedly.","");
          paVar8 = &(((ChainstateLoadResult *)local_168)->
                    super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                    super__Tuple_impl<1UL,_bilingual_str>.
                    super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original.field_2;
          local_168._0_8_ = paVar8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_168,local_120,(undefined1 *)((long)local_120 + local_118));
          paVar2 = &(((ChainstateLoadResult *)local_168)->
                    super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                    super__Tuple_impl<1UL,_bilingual_str>.
                    super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.translated.field_2;
          local_148._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)
                     &(((ChainstateLoadResult *)local_168)->
                      super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                      super__Tuple_impl<1UL,_bilingual_str>.
                      super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.translated,local_120,
                     (undefined1 *)((long)local_120 + local_118));
          paVar19 = &(__return_storage_ptr__->
                     super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                     super__Tuple_impl<1UL,_bilingual_str>.
                     super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original.field_2;
          (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>
          ).super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
          _M_head_impl.original._M_dataplus._M_p = (pointer)paVar19;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._0_8_ == paVar8) {
            paVar19->_M_allocated_capacity = CONCAT71(local_168._17_7_,local_168[0x10]);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                     super__Tuple_impl<1UL,_bilingual_str>.
                     super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original.field_2 + 8)
                 = local_168._24_8_;
          }
          else {
            (__return_storage_ptr__->
            super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
            super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
            _M_head_impl.original._M_dataplus._M_p = (pointer)local_168._0_8_;
            (__return_storage_ptr__->
            super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
            super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
            _M_head_impl.original.field_2._M_allocated_capacity =
                 CONCAT71(local_168._17_7_,local_168[0x10]);
          }
          (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>
          ).super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
          _M_head_impl.original._M_string_length = local_168._8_8_;
          local_168._8_8_ = (char *)0x0;
          local_168[0x10] = '\0';
          paVar19 = &(__return_storage_ptr__->
                     super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                     super__Tuple_impl<1UL,_bilingual_str>.
                     super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.translated.field_2;
          (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>
          ).super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
          _M_head_impl.translated._M_dataplus._M_p = (pointer)paVar19;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p == paVar2) {
            paVar19->_M_allocated_capacity =
                 CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                          local_148.field_2._M_local_buf[0]);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                     super__Tuple_impl<1UL,_bilingual_str>.
                     super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.translated.field_2 + 8
             ) = local_148.field_2._8_8_;
          }
          else {
            (__return_storage_ptr__->
            super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
            super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
            _M_head_impl.translated._M_dataplus._M_p = local_148._M_dataplus._M_p;
            (__return_storage_ptr__->
            super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
            super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
            _M_head_impl.translated.field_2._M_allocated_capacity =
                 CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                          local_148.field_2._M_local_buf[0]);
          }
          (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>
          ).super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
          _M_head_impl.translated._M_string_length = local_148._M_string_length;
          local_148._M_string_length = 0;
          local_148.field_2._M_local_buf[0] = '\0';
          (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>
          ).super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl = FAILURE_FATAL;
          paVar19 = local_120;
          local_168._0_8_ = paVar8;
          local_148._M_dataplus._M_p = (pointer)paVar2;
          if (local_120 == &local_110) goto LAB_00221e44;
        }
        operator_delete(paVar19,local_110._M_allocated_capacity + 1);
      }
      else if (SVar12 == SKIPPED) {
LAB_00221ed4:
        paVar19 = &(((ChainstateLoadResult *)local_168)->
                   super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                   super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>
                   ._M_head_impl.original.field_2;
        local_168._8_8_ = (char *)0x0;
        local_168[0x10] = '\0';
        paVar8 = &(((ChainstateLoadResult *)local_168)->
                  super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                  super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                  _M_head_impl.translated.field_2;
        local_148._M_string_length = 0;
        local_148.field_2._M_local_buf[0] = '\0';
        local_168._0_8_ = paVar19;
        local_148._M_dataplus._M_p = (pointer)paVar8;
        std::_Head_base<1UL,_bilingual_str,_false>::_Head_base
                  ((_Head_base<1UL,_bilingual_str,_false> *)__return_storage_ptr__,
                   (bilingual_str *)local_168);
        (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
        super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl = SUCCESS;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != paVar8) {
          operator_delete(local_148._M_dataplus._M_p,
                          CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                   local_148.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._0_8_ != paVar19) goto LAB_002220e6;
      }
      else {
        paVar19 = &(((ChainstateLoadResult *)local_168)->
                   super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                   super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>
                   ._M_head_impl.original.field_2;
        local_168._0_8_ = paVar19;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_168,
                   "UTXO snapshot failed to validate. Restart to resume normal initial block download, or try loading a different snapshot."
                   ,"");
        pbVar9 = &(((ChainstateLoadResult *)local_168)->
                  super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                  super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                  _M_head_impl.translated;
        paVar8 = &(((ChainstateLoadResult *)local_168)->
                  super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                  super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                  _M_head_impl.translated.field_2;
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_148._M_dataplus._M_p = (pointer)paVar8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)pbVar9,
                     "UTXO snapshot failed to validate. Restart to resume normal initial block download, or try loading a different snapshot."
                     ,"");
        }
        else {
          local_78[0] = 
          "UTXO snapshot failed to validate. Restart to resume normal initial block download, or try loading a different snapshot."
          ;
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    (pbVar9,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,local_78);
        }
        paVar2 = &(__return_storage_ptr__->
                  super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                  super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                  _M_head_impl.original.field_2;
        (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
        super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
        _M_head_impl.original._M_dataplus._M_p = (pointer)paVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._0_8_ == paVar19) {
          paVar2->_M_allocated_capacity = CONCAT71(local_168._17_7_,local_168[0x10]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->
                   super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                   super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>
                   ._M_head_impl.original.field_2 + 8) = local_168._24_8_;
        }
        else {
          (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>
          ).super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
          _M_head_impl.original._M_dataplus._M_p = (pointer)local_168._0_8_;
          (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>
          ).super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
          _M_head_impl.original.field_2._M_allocated_capacity =
               CONCAT71(local_168._17_7_,local_168[0x10]);
        }
        (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
        super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
        _M_head_impl.original._M_string_length = local_168._8_8_;
        local_168._8_8_ = (char *)0x0;
        local_168[0x10] = '\0';
        paVar2 = &(__return_storage_ptr__->
                  super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                  super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                  _M_head_impl.translated.field_2;
        (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
        super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
        _M_head_impl.translated._M_dataplus._M_p = (pointer)paVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p == paVar8) {
          paVar2->_M_allocated_capacity =
               CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                        local_148.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->
                   super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                   super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>
                   ._M_head_impl.translated.field_2 + 8) = local_148.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>
          ).super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
          _M_head_impl.translated._M_dataplus._M_p = local_148._M_dataplus._M_p;
          (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>
          ).super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
          _M_head_impl.translated.field_2._M_allocated_capacity =
               CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                        local_148.field_2._M_local_buf[0]);
        }
        (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
        super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
        _M_head_impl.translated._M_string_length = local_148._M_string_length;
        (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
        super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl = FAILURE;
        local_168._0_8_ = paVar19;
      }
    }
    else {
      std::_Head_base<1ul,bilingual_str,false>::_Head_base<bilingual_str&>
                ((_Head_base<1ul,bilingual_str,false> *)__return_storage_ptr__,
                 (bilingual_str *)local_100);
      (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
      super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl = local_c0._M_head_impl;
    }
LAB_00221e44:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_p != &local_d0) {
      operator_delete(local_e0._M_p,
                      CONCAT71(local_d0._M_allocated_capacity._1_7_,local_d0._M_local_buf[0]) + 1);
    }
    if ((long *)local_100._0_8_ == plVar3) goto LAB_00221e82;
    local_a8[0] = CONCAT71(local_100._17_7_,local_100[0x10]);
    plVar18 = (long *)local_100._0_8_;
  }
  operator_delete(plVar18,local_a8[0] + 1);
LAB_00221e82:
  std::unique_lock<std::recursive_mutex>::~unique_lock(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

ChainstateLoadResult LoadChainstate(ChainstateManager& chainman, const CacheSizes& cache_sizes,
                                    const ChainstateLoadOptions& options)
{
    if (!chainman.AssumedValidBlock().IsNull()) {
        LogPrintf("Assuming ancestors of block %s have valid signatures.\n", chainman.AssumedValidBlock().GetHex());
    } else {
        LogPrintf("Validating signatures for all blocks.\n");
    }
    LogPrintf("Setting nMinimumChainWork=%s\n", chainman.MinimumChainWork().GetHex());
    if (chainman.MinimumChainWork() < UintToArith256(chainman.GetConsensus().nMinimumChainWork)) {
        LogPrintf("Warning: nMinimumChainWork set below default value of %s\n", chainman.GetConsensus().nMinimumChainWork.GetHex());
    }
    if (chainman.m_blockman.GetPruneTarget() == BlockManager::PRUNE_TARGET_MANUAL) {
        LogPrintf("Block pruning enabled.  Use RPC call pruneblockchain(height) to manually prune block and undo files.\n");
    } else if (chainman.m_blockman.GetPruneTarget()) {
        LogPrintf("Prune configured to target %u MiB on disk for block and undo files.\n", chainman.m_blockman.GetPruneTarget() / 1024 / 1024);
    }

    LOCK(cs_main);

    chainman.m_total_coinstip_cache = cache_sizes.coins;
    chainman.m_total_coinsdb_cache = cache_sizes.coins_db;

    // Load the fully validated chainstate.
    chainman.InitializeChainstate(options.mempool);

    // Load a chain created from a UTXO snapshot, if any exist.
    bool has_snapshot = chainman.DetectSnapshotChainstate();

    if (has_snapshot && options.wipe_chainstate_db) {
        LogPrintf("[snapshot] deleting snapshot chainstate due to reindexing\n");
        if (!chainman.DeleteSnapshotChainstate()) {
            return {ChainstateLoadStatus::FAILURE_FATAL, Untranslated("Couldn't remove snapshot chainstate.")};
        }
    }

    auto [init_status, init_error] = CompleteChainstateInitialization(chainman, cache_sizes, options);
    if (init_status != ChainstateLoadStatus::SUCCESS) {
        return {init_status, init_error};
    }

    // If a snapshot chainstate was fully validated by a background chainstate during
    // the last run, detect it here and clean up the now-unneeded background
    // chainstate.
    //
    // Why is this cleanup done here (on subsequent restart) and not just when the
    // snapshot is actually validated? Because this entails unusual
    // filesystem operations to move leveldb data directories around, and that seems
    // too risky to do in the middle of normal runtime.
    auto snapshot_completion = chainman.MaybeCompleteSnapshotValidation();

    if (snapshot_completion == SnapshotCompletionResult::SKIPPED) {
        // do nothing; expected case
    } else if (snapshot_completion == SnapshotCompletionResult::SUCCESS) {
        LogPrintf("[snapshot] cleaning up unneeded background chainstate, then reinitializing\n");
        if (!chainman.ValidatedSnapshotCleanup()) {
            return {ChainstateLoadStatus::FAILURE_FATAL, Untranslated("Background chainstate cleanup failed unexpectedly.")};
        }

        // Because ValidatedSnapshotCleanup() has torn down chainstates with
        // ChainstateManager::ResetChainstates(), reinitialize them here without
        // duplicating the blockindex work above.
        assert(chainman.GetAll().empty());
        assert(!chainman.IsSnapshotActive());
        assert(!chainman.IsSnapshotValidated());

        chainman.InitializeChainstate(options.mempool);

        // A reload of the block index is required to recompute setBlockIndexCandidates
        // for the fully validated chainstate.
        chainman.ActiveChainstate().ClearBlockIndexCandidates();

        auto [init_status, init_error] = CompleteChainstateInitialization(chainman, cache_sizes, options);
        if (init_status != ChainstateLoadStatus::SUCCESS) {
            return {init_status, init_error};
        }
    } else {
        return {ChainstateLoadStatus::FAILURE, _(
           "UTXO snapshot failed to validate. "
           "Restart to resume normal initial block download, or try loading a different snapshot.")};
    }

    return {ChainstateLoadStatus::SUCCESS, {}};
}